

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

void __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::ExplicitProducer::~ExplicitProducer(ExplicitProducer *this)

{
  void *pvVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  void *__ptr;
  Block *block;
  Block *pBVar5;
  Block *pBVar6;
  
  (this->super_ProducerBase)._vptr_ProducerBase = (_func_int **)&PTR__ExplicitProducer_002f65e8;
  pBVar5 = (this->super_ProducerBase).tailBlock;
  if (pBVar5 != (Block *)0x0) {
    if (((this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i & 0x1f) == 0)
    {
      pBVar6 = (Block *)0x0;
    }
    else {
      uVar3 = this->pr_blockIndexFront - this->pr_blockIndexSlotsUsed;
      do {
        uVar4 = uVar3 & this->pr_blockIndexSize - 1;
        uVar3 = uVar4 + 1;
      } while (0x8000000000000000 <
               (this->pr_blockIndexEntries[uVar4].base -
               (this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i) + 0x20)
      ;
      pBVar6 = this->pr_blockIndexEntries[uVar4].block;
    }
    do {
      pBVar5 = pBVar5->next;
      bVar2 = ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
              ::Block::
              is_empty<(ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::InnerQueueContext)1>
                        (pBVar5);
      if (!bVar2) {
        if (pBVar5 == pBVar6) {
          uVar3 = (ulong)((uint)(this->super_ProducerBase).headIndex.
                                super___atomic_base<unsigned_long>._M_i & 0x1f);
        }
        else {
          uVar3 = 0;
        }
        uVar4 = 0x20;
        if (((this->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i & 0x1f) !=
            0) {
          uVar4 = (ulong)((uint)(this->super_ProducerBase).tailIndex.
                                super___atomic_base<unsigned_long>._M_i & 0x1f);
        }
        while ((uVar3 != 0x20 &&
               ((uVar4 != uVar3 || (pBVar5 != (this->super_ProducerBase).tailBlock))))) {
          std::
          unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>::
          ~unique_ptr((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                       *)(pBVar5->elements + (ulong)((uint)uVar3 & 0x1f) * 8));
          uVar3 = uVar3 + 1;
        }
      }
      block = (this->super_ProducerBase).tailBlock;
    } while (pBVar5 != block);
    do {
      pBVar5 = block->next;
      add_block_to_free_list((this->super_ProducerBase).parent,block);
      block = pBVar5;
    } while (pBVar5 != (this->super_ProducerBase).tailBlock);
  }
  __ptr = this->pr_blockIndexRaw;
  while (__ptr != (void *)0x0) {
    pvVar1 = *(void **)((long)__ptr + 0x18);
    free(__ptr);
    __ptr = pvVar1;
  }
  return;
}

Assistant:

~ExplicitProducer() {
      // Destruct any elements not yet dequeued.
      // Since we're in the destructor, we can assume all elements
      // are either completely dequeued or completely not (no halfways).
      if (this->tailBlock !=
          nullptr) {  // Note this means there must be a block index too
        // First find the block that's partially dequeued, if any
        Block* halfDequeuedBlock = nullptr;
        if ((this->headIndex.load(std::memory_order_relaxed) &
             static_cast<index_t>(QUEUE_BLOCK_SIZE - 1)) != 0) {
          // The head's not on a block boundary, meaning a block somewhere is
          // partially dequeued (or the head block is the tail block and was
          // fully dequeued, but the head/tail are still not on a boundary)
          size_t i = (pr_blockIndexFront - pr_blockIndexSlotsUsed) &
                     (pr_blockIndexSize - 1);
          while (details::circular_less_than<index_t>(
              pr_blockIndexEntries[i].base + QUEUE_BLOCK_SIZE,
              this->headIndex.load(std::memory_order_relaxed))) {
            i = (i + 1) & (pr_blockIndexSize - 1);
          }
          assert(details::circular_less_than<index_t>(
              pr_blockIndexEntries[i].base,
              this->headIndex.load(std::memory_order_relaxed)));
          halfDequeuedBlock = pr_blockIndexEntries[i].block;
        }

        // Start at the head block (note the first line in the loop gives us the
        // head from the tail on the first iteration)
        auto block = this->tailBlock;
        do {
          block = block->next;
          if (block->ConcurrentQueue::Block::template is_empty<
                  explicit_context>()) {
            continue;
          }

          size_t i = 0;  // Offset into block
          if (block == halfDequeuedBlock) {
            i = static_cast<size_t>(
                this->headIndex.load(std::memory_order_relaxed) &
                static_cast<index_t>(QUEUE_BLOCK_SIZE - 1));
          }

          // Walk through all the items in the block; if this is the tail block,
          // we need to stop when we reach the tail index
          auto lastValidIndex =
              (this->tailIndex.load(std::memory_order_relaxed) &
               static_cast<index_t>(QUEUE_BLOCK_SIZE - 1)) == 0
                  ? QUEUE_BLOCK_SIZE
                  : static_cast<size_t>(
                        this->tailIndex.load(std::memory_order_relaxed) &
                        static_cast<index_t>(QUEUE_BLOCK_SIZE - 1));
          while (i != QUEUE_BLOCK_SIZE &&
                 (block != this->tailBlock || i != lastValidIndex)) {
            (*block)[i++]->~T();
          }
        } while (block != this->tailBlock);
      }

      // Destroy all blocks that we own
      if (this->tailBlock != nullptr) {
        auto block = this->tailBlock;
        do {
          auto nextBlock = block->next;
          this->parent->add_block_to_free_list(block);
          block = nextBlock;
        } while (block != this->tailBlock);
      }

      // Destroy the block indices
      auto header = static_cast<BlockIndexHeader*>(pr_blockIndexRaw);
      while (header != nullptr) {
        auto prev = static_cast<BlockIndexHeader*>(header->prev);
        header->~BlockIndexHeader();
        (Traits::free)(header);
        header = prev;
      }
    }